

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
PvrLegacyHeader::ToStringArray_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PvrLegacyHeader *this)

{
  uint uVar1;
  iterator iVar2;
  uint flags;
  char *pcVar3;
  char *pcVar4;
  string magic_number_string;
  string num_surfaces_string;
  uint32_t pixel_format;
  string pixel_format_string;
  string sStack_a8;
  string local_88;
  string local_68;
  uint local_44;
  value_type local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_44 = (uint)(byte)(this->impl_v1_).pixel_format_flags;
  iVar2 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)PvrLegacyInfo::pixel_format_names_abi_cxx11_,&local_44);
  std::__cxx11::string::string((string *)&local_40,(string *)&iVar2._M_node[1]._M_parent);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_40);
  std::__cxx11::to_string(&local_88,(this->impl_v1_).bit_count);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::to_string(&local_88,(this->impl_v1_).width);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::to_string(&local_88,(this->impl_v1_).height);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  uVar1 = (this->impl_v2_).num_surfaces;
  if (uVar1 == 0) {
    std::__cxx11::string::string((string *)&local_88,"-",(allocator *)&sStack_a8);
  }
  else {
    std::__cxx11::to_string(&local_88,uVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_88);
  std::__cxx11::to_string(&sStack_a8,(this->impl_v1_).mip_map_count + 1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&sStack_a8);
  std::__cxx11::string::~string((string *)&sStack_a8);
  pcVar4 = "True";
  pcVar3 = "True";
  if ((this->impl_v1_).red_mask == 0) {
    pcVar3 = "False";
  }
  std::__cxx11::string::string((string *)&sStack_a8,pcVar3,(allocator *)&local_68);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&sStack_a8);
  std::__cxx11::string::~string((string *)&sStack_a8);
  pcVar3 = "True";
  if ((this->impl_v1_).green_mask == 0) {
    pcVar3 = "False";
  }
  std::__cxx11::string::string((string *)&sStack_a8,pcVar3,(allocator *)&local_68);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&sStack_a8);
  std::__cxx11::string::~string((string *)&sStack_a8);
  pcVar3 = "True";
  if ((this->impl_v1_).blue_mask == 0) {
    pcVar3 = "False";
  }
  std::__cxx11::string::string((string *)&sStack_a8,pcVar3,(allocator *)&local_68);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&sStack_a8);
  std::__cxx11::string::~string((string *)&sStack_a8);
  if ((this->impl_v1_).alpha_mask == 0) {
    pcVar4 = "False";
  }
  std::__cxx11::string::string((string *)&sStack_a8,pcVar4,(allocator *)&local_68);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&sStack_a8);
  std::__cxx11::string::~string((string *)&sStack_a8);
  uVar1 = (this->impl_v2_).magic_number;
  if (uVar1 == 0) {
    std::__cxx11::string::string((string *)&sStack_a8,"-",(allocator *)&local_68);
  }
  else {
    std::__cxx11::to_string(&sStack_a8,uVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&sStack_a8);
  PvrLegacyInfo::PrintFlagNames_abi_cxx11_
            (&local_68,(PvrLegacyInfo *)(ulong)(this->impl_v1_).pixel_format_flags,flags);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::to_string(&local_68,(this->impl_v1_).data_size);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&sStack_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> ToStringArray() {
      std::vector<std::string> output;
      const auto& impl_v1(this->impl_v1_);
      const auto& impl_v2(this->impl_v2_);
      const std::uint32_t pixel_format(impl_v1.pixel_format_flags&PvrLegacyInfo::kPixelTypeMask);
      const std::string pixel_format_string(PvrLegacyInfo::pixel_format_names.find(pixel_format)->second);
      output.push_back(pixel_format_string);
      output.push_back(std::to_string(impl_v1.bit_count));
      output.push_back(std::to_string(impl_v1.width));
      output.push_back(std::to_string(impl_v1.height));
      const std::string num_surfaces_string(
        impl_v2.num_surfaces == 0?std::string("-"):std::to_string(impl_v2.num_surfaces));
      output.push_back(num_surfaces_string);
      output.push_back(std::to_string(impl_v1.mip_map_count+1));
      output.push_back(impl_v1.red_mask==0?"False":"True");
      output.push_back(impl_v1.green_mask==0?"False":"True");
      output.push_back(impl_v1.blue_mask==0?"False":"True");
      output.push_back(impl_v1.alpha_mask==0?"False":"True");
      const std::string magic_number_string(
        impl_v2.magic_number == 0?std::string("-"):std::to_string(impl_v2.magic_number));
      output.push_back(magic_number_string);
      output.push_back(PvrLegacyInfo::PrintFlagNames(impl_v1.pixel_format_flags));
      output.push_back(std::to_string(impl_v1.data_size));
      return output;
    }